

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

U64 __thiscall position::attackers_of2(position *this,Square *s,Color *c)

{
  Color CVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  U64 UVar8;
  U64 UVar9;
  ulong uVar10;
  U64 m;
  ulong local_38;
  
  local_38 = (this->pcs).bycolor._M_elems[1] | (this->pcs).bycolor._M_elems[0];
  CVar1 = *c;
  uVar2 = (this->pcs).bitmap._M_elems[CVar1]._M_elems[0];
  uVar3 = (this->pcs).bitmap._M_elems[CVar1]._M_elems[1];
  uVar4 = (this->pcs).bitmap._M_elems[CVar1]._M_elems[2];
  uVar5 = (this->pcs).bitmap._M_elems[CVar1]._M_elems[3];
  uVar6 = (this->pcs).bitmap._M_elems[CVar1]._M_elems[4];
  uVar7 = (this->pcs).bitmap._M_elems[CVar1]._M_elems[5];
  UVar8 = magics::attacks<(Piece)2>(&local_38,s);
  UVar9 = magics::attacks<(Piece)3>(&local_38,s);
  uVar10 = (ulong)*s;
  return UVar9 & uVar5 | uVar4 & UVar8 | (UVar9 | UVar8) & uVar6 |
         uVar3 & (&bitboards::nmask)[uVar10] | uVar7 & (&bitboards::kmask)[uVar10] |
         uVar2 & (&bitboards::pattks)[((long)(int)*c ^ 1U) * 0x40 + uVar10];
}

Assistant:

U64 position::attackers_of2(const Square& s, const Color& c) const {
	// attackers of square "s" by color "c"
	U64 m = all_pieces();
	auto p = pcs.bitmap[c];
	U64 battck = magics::attacks<bishop>(m, s);
	U64 rattck = magics::attacks<rook>(m, s);
	U64 qattck = battck | rattck;

	return ((bitboards::pattks[c ^ 1][s] & p[pawn]) |
		(bitboards::nmask[s] & p[knight]) |
		(bitboards::kmask[s] & p[king]) |
		(battck & p[bishop]) |
		(rattck & p[rook]) |
		(qattck & p[queen]));
}